

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability> spvtools::opt::Handler_OpTypeImage_ImageMSArray(Instruction *instruction)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  _Optional_payload_base<spv::Capability> _Var4;
  uint uVar5;
  
  if (instruction->opcode_ == OpTypeImage) {
    uVar5 = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      uVar5 = (uint)instruction->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(instruction,uVar5 + 3);
    uVar5 = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      uVar5 = (uint)instruction->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(instruction,uVar5 | 4);
    uVar5 = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      uVar5 = (uint)instruction->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(instruction,uVar5 + 5);
    _Var4._M_payload = (_Storage<spv::Capability,_true>)0x30;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
    if (uVar2 == 1) {
      _Var4 = (_Optional_payload_base<spv::Capability>)
              ((ulong)(uVar3 == 2 && uVar1 == 1) << 0x20 | 0x30);
    }
    return (optional<spv::Capability>)_Var4;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpTypeImage && \"This handler only support OpTypeImage opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x136,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpTypeImage_ImageMSArray(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability> Handler_OpTypeImage_ImageMSArray(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypeImage &&
         "This handler only support OpTypeImage opcodes.");

  const uint32_t arrayed =
      instruction->GetSingleWordInOperand(kOpTypeImageArrayedIndex);
  const uint32_t ms = instruction->GetSingleWordInOperand(kOpTypeImageMSIndex);
  const uint32_t sampled =
      instruction->GetSingleWordInOperand(kOpTypeImageSampledIndex);

  return arrayed == 1 && sampled == 2 && ms == 1
             ? std::optional(spv::Capability::ImageMSArray)
             : std::nullopt;
}